

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_file_writer.cc
# Opt level: O2

unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_> __thiscall
draco::StdioFileWriter::Open(StdioFileWriter *this,string *file_name)

{
  bool bVar1;
  FILE *__stream;
  _func_int **pp_Var2;
  
  if (file_name->_M_string_length != 0) {
    bVar1 = CheckAndCreatePathForFile(file_name);
    if (bVar1) {
      __stream = fopen64((file_name->_M_dataplus)._M_p,"wb");
      if (__stream != (FILE *)0x0) {
        pp_Var2 = (_func_int **)operator_new(0x10,(nothrow_t *)&std::nothrow);
        if (pp_Var2 == (_func_int **)0x0) {
          pp_Var2 = (_func_int **)0x0;
          fprintf(_stderr,"%s:%d (%s): %s.\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]draco/src/draco/io/stdio_file_writer.cc"
                  ,0x2b,"Open","Out of memory");
          fclose(__stream);
        }
        else {
          *pp_Var2 = (_func_int *)&PTR__StdioFileWriter_0017bdc0;
          pp_Var2[1] = (_func_int *)__stream;
        }
        goto LAB_00119913;
      }
    }
  }
  pp_Var2 = (_func_int **)0x0;
LAB_00119913:
  (this->super_FileWriterInterface)._vptr_FileWriterInterface = pp_Var2;
  return (__uniq_ptr_data<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>,_true,_true>
          )(__uniq_ptr_data<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FileWriterInterface> StdioFileWriter::Open(
    const std::string &file_name) {
  if (file_name.empty()) {
    return nullptr;
  }
  if (!CheckAndCreatePathForFile(file_name)) {
    return nullptr;
  }

  FILE *raw_file_ptr = fopen(file_name.c_str(), "wb");
  if (raw_file_ptr == nullptr) {
    return nullptr;
  }

  std::unique_ptr<StdioFileWriter> file(new (std::nothrow)
                                            StdioFileWriter(raw_file_ptr));
  if (file == nullptr) {
    FILEWRITER_LOG_ERROR("Out of memory");
    fclose(raw_file_ptr);
    return nullptr;
  }

#ifndef DRACO_OLD_GCC
  return file;
#else
  return std::move(file);
#endif
}